

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O1

void __thiscall banksia::ChessBoard::clearCastleRights(ChessBoard *this,int rookPos,Side rookSide)

{
  byte bVar1;
  
  if (rookPos < 0x38) {
    if (rookPos == 0) {
      if (rookSide == black) {
        bVar1 = (byte)this->CastleRight_long;
        goto LAB_0017f22a;
      }
    }
    else if ((rookPos == 7) && (rookSide == black)) {
      bVar1 = (byte)this->CastleRight_short;
LAB_0017f22a:
      this->castleRights[0] = this->castleRights[0] & ~bVar1;
      return;
    }
  }
  else if (rookPos == 0x38) {
    if (rookSide == white) {
      bVar1 = (byte)this->CastleRight_long;
      goto LAB_0017f21b;
    }
  }
  else if ((rookPos == 0x3f) && (rookSide == white)) {
    bVar1 = (byte)this->CastleRight_short;
LAB_0017f21b:
    this->castleRights[1] = this->castleRights[1] & ~bVar1;
    return;
  }
  return;
}

Assistant:

void ChessBoard::clearCastleRights(int rookPos, Side rookSide) {
    switch (rookPos) {
        case 0:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_long;
            }
            break;
        case 7:
            if (rookSide == Side::black) {
                castleRights[B] &= ~CastleRight_short;
            }
            break;
        case 56:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_long;
            }
            break;
        case 63:
            if (rookSide == Side::white) {
                castleRights[W] &= ~CastleRight_short;
            }
            break;
    }
}